

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O3

int lwrite(lua_State *L)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *__src;
  int *piVar4;
  size_t sz;
  size_t local_30;
  
  puVar3 = (undefined8 *)luaL_checkudata(L,1,"debugchannel");
  __src = luaL_checklstring(L,2,&local_30);
  piVar2 = (int *)*puVar3;
  puVar3 = (undefined8 *)malloc(local_30 + 0x10);
  puVar3[1] = local_30;
  *puVar3 = 0;
  memcpy(puVar3 + 2,__src,local_30);
  do {
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = 1;
    UNLOCK();
  } while (iVar1 != 0);
  piVar4 = piVar2 + 2;
  if (*(int **)(piVar2 + 4) != (int *)0x0) {
    piVar4 = *(int **)(piVar2 + 4);
  }
  *(undefined8 **)piVar4 = puVar3;
  *(undefined8 **)(piVar2 + 4) = puVar3;
  *piVar2 = 0;
  return 0;
}

Assistant:

static int
lwrite(lua_State *L) {
	struct channel_box *cb = luaL_checkudata(L,1, METANAME);
	size_t sz;
	const char * str = luaL_checklstring(L, 2, &sz);
	channel_write(cb->c, str, sz);
	return 0;
}